

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

double __thiscall chrono::robosimian::RS_Limb::GetMotorOmega(RS_Limb *this,string *motor_name)

{
  const_iterator cVar1;
  ostream *poVar2;
  double dVar3;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_motors)._M_h,motor_name);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    dVar3 = (double)(**(code **)(**(long **)((long)cVar1.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
                                                  ._M_cur + 0x28) + 0x270))();
    return dVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Limb::GetMotorOmega -- Unknown motor ");
  poVar2 = std::operator<<(poVar2,(string *)motor_name);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0.0;
}

Assistant:

double RS_Limb::GetMotorOmega(const std::string& motor_name) const {
    auto itr = m_motors.find(motor_name);
    if (itr == m_motors.end()) {
        std::cout << "Limb::GetMotorOmega -- Unknown motor " << motor_name << std::endl;
        return 0;
    }

    return itr->second->GetMotorRot_dt();
}